

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>,_bool>
 __thiscall
itlib::
flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
::emplace<char_const(&)[9],Rml::Variant>
          (flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           *this,char (*args) [9],Variant *args_1)

{
  undefined1 auVar1 [12];
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>,_bool>
  pVar2;
  value_type val;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_60;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[9],_Rml::Variant,_true>(&local_60,args,args_1);
  pVar2 = insert<std::pair<std::__cxx11::string,Rml::Variant>>(this,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::~pair(&local_60);
  auVar1 = pVar2._0_12_;
  pVar2._12_4_ = 0;
  pVar2.first._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)auVar1._0_8_;
  pVar2.second = (bool)auVar1[8];
  pVar2._9_3_ = auVar1._9_3_;
  return pVar2;
}

Assistant:

std::pair<iterator, bool> emplace(Args&&... args)
    {
        value_type val(std::forward<Args>(args)...);
        return insert(std::move(val));
    }